

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,double,double,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool,false,true>
               (double *ldata,double *rdata,double *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  double dVar1;
  double *pdVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  byte bVar6;
  double dVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  double *pdVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  ulong uVar13;
  ulong uVar14;
  idx_t idx_in_entry_1;
  ulong uVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  double *local_80;
  double *local_78;
  idx_t local_70;
  double *local_68;
  double *local_60;
  idx_t local_58;
  ulong local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  double local_40;
  ulong local_38;
  
  local_68 = ldata;
  local_60 = rdata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar1 = *rdata;
      uVar16 = 0;
      do {
        pdVar2 = (double *)local_68[uVar16];
        uVar17 = SUB84(pdVar2,0);
        uVar18 = (undefined4)((ulong)pdVar2 >> 0x20);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar7 = fmod((double)pdVar2,dVar1);
          uVar17 = SUB84(dVar7,0);
          uVar18 = (undefined4)((ulong)dVar7 >> 0x20);
        }
        else {
          _Var12._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_70 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            local_78 = pdVar2;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_70);
            p_Var9 = p_Stack_90;
            peVar8 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar8;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var9;
            if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var12._M_head_impl =
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var12._M_head_impl;
            uVar17 = SUB84(local_78,0);
            uVar18 = (undefined4)((ulong)local_78 >> 0x20);
          }
          bVar6 = (byte)uVar16 & 0x3f;
          _Var12._M_head_impl[uVar16 >> 6] =
               _Var12._M_head_impl[uVar16 >> 6] &
               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        result_data[uVar16] = (double)CONCAT44(uVar18,uVar17);
        uVar16 = uVar16 + 1;
      } while (count != uVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_48 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_38 = 0;
    uVar16 = 0;
    local_80 = result_data;
    local_58 = count;
    do {
      pdVar10 = local_68;
      pdVar2 = local_80;
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar13 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar13 = count;
        }
LAB_014b3c20:
        uVar14 = uVar16;
        if (uVar16 < uVar13) {
          dVar1 = *local_60;
          do {
            pdVar2 = (double *)pdVar10[uVar16];
            uVar17 = SUB84(pdVar2,0);
            uVar18 = (undefined4)((ulong)pdVar2 >> 0x20);
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              dVar7 = fmod((double)pdVar2,dVar1);
              uVar17 = SUB84(dVar7,0);
              uVar18 = (undefined4)((ulong)dVar7 >> 0x20);
            }
            else {
              _Var12._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
              ;
              if (_Var12._M_head_impl == (unsigned_long *)0x0) {
                local_70 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                local_78 = pdVar2;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_98,&local_70);
                p_Var9 = p_Stack_90;
                peVar8 = local_98;
                local_98 = (element_type *)0x0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar8;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var9;
                if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
                   p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                }
                pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_48);
                _Var12._M_head_impl =
                     (pTVar11->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var12._M_head_impl;
                uVar17 = SUB84(local_78,0);
                uVar18 = (undefined4)((ulong)local_78 >> 0x20);
              }
              bVar6 = (byte)uVar16 & 0x3f;
              _Var12._M_head_impl[uVar16 >> 6] =
                   _Var12._M_head_impl[uVar16 >> 6] &
                   (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
            }
            result_data[uVar16] = (double)CONCAT44(uVar18,uVar17);
            uVar16 = uVar16 + 1;
            uVar14 = uVar13;
          } while (uVar13 != uVar16);
        }
      }
      else {
        uVar4 = puVar3[local_38];
        uVar13 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar13 = count;
        }
        uVar14 = uVar13;
        result_data = local_80;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_014b3c20;
          uVar14 = uVar16;
          count = local_58;
          if (uVar16 < uVar13) {
            local_78 = local_68 + uVar16;
            uVar15 = 0;
            do {
              if ((uVar4 >> (uVar15 & 0x3f) & 1) != 0) {
                dVar1 = local_78[uVar15];
                uVar17 = SUB84(dVar1,0);
                uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
                dVar7 = *local_60;
                if ((dVar7 != 0.0) || (NAN(dVar7))) {
                  dVar1 = fmod(dVar1,dVar7);
                  uVar17 = SUB84(dVar1,0);
                  uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
                }
                else {
                  _Var12._M_head_impl =
                       (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                  if (_Var12._M_head_impl == (unsigned_long *)0x0) {
                    local_70 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    local_40 = dVar1;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_70);
                    p_Var9 = p_Stack_90;
                    peVar8 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar8;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var9;
                    if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
                       p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(local_48);
                    _Var12._M_head_impl =
                         (pTVar11->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var12._M_head_impl;
                    uVar17 = SUB84(local_40,0);
                    uVar18 = (undefined4)((ulong)local_40 >> 0x20);
                  }
                  bVar6 = (byte)(uVar16 + uVar15) & 0x3f;
                  _Var12._M_head_impl[uVar16 + uVar15 >> 6] =
                       _Var12._M_head_impl[uVar16 + uVar15 >> 6] &
                       (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                }
                pdVar2[uVar16 + uVar15] = (double)CONCAT44(uVar18,uVar17);
              }
              uVar15 = uVar15 + 1;
              uVar14 = uVar13;
              count = local_58;
              result_data = local_80;
            } while (uVar13 - uVar16 != uVar15);
          }
        }
      }
      local_38 = local_38 + 1;
      uVar16 = uVar14;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}